

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

bool __thiscall xmrig::Client::parseJob(Client *this,Value *params,int *code)

{
  bool bVar1;
  Mode MVar2;
  Type pGVar3;
  String *pSVar4;
  uint64_t height;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar5;
  allocator_type *__a;
  reference pvVar6;
  ulong iters;
  char *pcVar7;
  undefined4 *in_RDX;
  int iVar8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RSI;
  size_type sVar9;
  Client *in_RDI;
  uint64_t extra_iters;
  uint32_t id_num;
  uint8_t id_num_bytes [4];
  int read;
  uint64_t t_stamp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> b;
  size_t blob_size;
  uint8_t *blob;
  Job job;
  Job *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  Job *in_stack_fffffffffffffd68;
  String *in_stack_fffffffffffffd70;
  Value *in_stack_fffffffffffffd78;
  String *in_stack_fffffffffffffd88;
  Job *in_stack_fffffffffffffd90;
  uchar *__last;
  Job *in_stack_fffffffffffffd98;
  uchar *__first;
  uint local_1b0;
  undefined4 local_1ac;
  uchar *local_1a8;
  uchar *local_1a0;
  int local_194;
  ulong local_190;
  uchar local_181;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_180;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_168;
  uint8_t *local_160;
  undefined4 local_138;
  Job local_128;
  undefined4 *local_20;
  byte local_1;
  
  local_20 = in_RDX;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsObject(in_RSI);
  if (!bVar1) {
    *local_20 = 2;
    local_1 = 0;
    goto LAB_001c0751;
  }
  Job::Job(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                      (char *)in_stack_fffffffffffffd58);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GetString(pGVar3);
  bVar1 = Job::setId((Job *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                     (char *)in_stack_fffffffffffffd58);
  if (bVar1) {
    MVar2 = Pool::mode(&(in_RDI->super_BaseClient).m_pool);
    if (MVar2 == MODE_SELF_SELECT) {
      Json::getString(in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70,
                      (char *)in_stack_fffffffffffffd68);
      String::String(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
      Job::setExtraNonce((Job *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                         (String *)in_stack_fffffffffffffd58);
      String::~String((String *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
      Json::getString(in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70,
                      (char *)in_stack_fffffffffffffd68);
      String::String(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
      Job::setPoolWallet((Job *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                         (String *)in_stack_fffffffffffffd58);
      String::~String((String *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
      pSVar4 = Job::extraNonce(&local_128);
      bVar1 = String::isNull(pSVar4);
      if (!bVar1) {
        pSVar4 = Job::poolWallet(&local_128);
        bVar1 = String::isNull(pSVar4);
        if (!bVar1) goto LAB_001c02c0;
      }
      *local_20 = 4;
      local_1 = 0;
      local_138 = 1;
    }
    else {
      pGVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                          (char *)in_stack_fffffffffffffd58);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GetString(pGVar3);
      bVar1 = Job::setBlob(in_stack_fffffffffffffd68,
                           (char *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
      if (bVar1) {
LAB_001c02c0:
        pGVar3 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                            (char *)in_stack_fffffffffffffd58);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GetString(pGVar3);
        bVar1 = Job::setTarget(in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
        if (bVar1) {
          height = Json::getUint64(in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70,
                                   (uint64_t)in_stack_fffffffffffffd68);
          Job::setHeight(&local_128,height);
          Job::setClientId((Job *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                           (String *)in_stack_fffffffffffffd58);
          iVar8 = (int)&local_128;
          bVar1 = Job::operator!=((Job *)CONCAT17(in_stack_fffffffffffffd67,
                                                  in_stack_fffffffffffffd60),
                                  in_stack_fffffffffffffd58);
          if (bVar1) {
            in_RDI->m_jobs = in_RDI->m_jobs + 1;
            Job::operator=((Job *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                           in_stack_fffffffffffffd58);
            local_160 = Job::blob(&(in_RDI->super_BaseClient).m_job);
            pvVar5 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     Job::size(&(in_RDI->super_BaseClient).m_job);
            __a = (allocator_type *)(local_160 + 2);
            __last = (undefined1 *)
                     ((long)&pvVar5[-1].
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 6) +
                     (long)local_160;
            __first = &local_181;
            local_168 = pvVar5;
            std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1c0460);
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            vector<unsigned_char_const*,void>(pvVar5,__first,__last,__a);
            std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1c048b);
            local_190 = 0;
            local_1a0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *
                                            )in_stack_fffffffffffffd58);
            local_1a8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *
                                            )in_stack_fffffffffffffd58);
            local_194 = tools::
                        read_varint<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_long>
                                  ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    *)in_stack_fffffffffffffd58,(unsigned_long *)0x1c04e0);
            memset(&local_1ac,0,4);
            sVar9 = (size_type)local_194;
            local_194 = local_194 + 1;
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (&local_180,sVar9);
            local_1ac._0_3_ = CONCAT12(*pvVar6,(undefined2)local_1ac);
            sVar9 = (size_type)local_194;
            local_194 = local_194 + 1;
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (&local_180,sVar9);
            local_1ac._0_2_ = CONCAT11(*pvVar6,(undefined1)local_1ac);
            sVar9 = (size_type)local_194;
            local_194 = local_194 + 1;
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (&local_180,sVar9);
            local_1ac = CONCAT31(local_1ac._1_3_,*pvVar6);
            local_1b0 = local_1ac;
            if (local_1ac == 0) {
              local_1b0 = 1;
            }
            iVar8 = (int)(local_190 % (ulong)local_1b0);
            pvVar5 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     Job::height(&local_128);
            iters = (ulong)(iVar8 + (int)pvVar5 & 0x7fff);
            printf("%lu\n",iters + 0x40000);
            Job::setExtraIters(&(in_RDI->super_BaseClient).m_job,iters);
            local_1 = 1;
            local_138 = 1;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(pvVar5);
          }
          else if (in_RDI->m_jobs == 0) {
            local_1 = 0;
            local_138 = 1;
          }
          else {
            in_stack_fffffffffffffd67 = BaseClient::isQuiet(&in_RDI->super_BaseClient);
            if (!(bool)in_stack_fffffffffffffd67) {
              pcVar7 = url((Client *)0x1c06f0);
              iVar8 = 0x27a514;
              Log::print(WARNING,"[%s] duplicate job received, reconnect",pcVar7);
            }
            close(in_RDI,iVar8);
            local_1 = 0;
            local_138 = 1;
          }
        }
        else {
          *local_20 = 5;
          local_1 = 0;
          local_138 = 1;
        }
      }
      else {
        *local_20 = 4;
        local_1 = 0;
        local_138 = 1;
      }
    }
  }
  else {
    *local_20 = 3;
    local_1 = 0;
    local_138 = 1;
  }
  Job::~Job((Job *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
LAB_001c0751:
  return (bool)(local_1 & 1);
}

Assistant:

bool xmrig::Client::parseJob(const rapidjson::Value &params, int *code)
{
    if (!params.IsObject()) {
        *code = 2;
        return false;
    }

    Job job(m_rpcId);

    if (!job.setId(params["job_id"].GetString())) {
        *code = 3;
        return false;
    }

#   ifdef XMRIG_FEATURE_HTTP
    if (m_pool.mode() == Pool::MODE_SELF_SELECT) {
        job.setExtraNonce(Json::getString(params, "extra_nonce"));
        job.setPoolWallet(Json::getString(params, "pool_wallet"));

        if (job.extraNonce().isNull() || job.poolWallet().isNull()) {
            *code = 4;
            return false;
        }
    }
    else
#   endif
    {
        if (!job.setBlob(params["blob"].GetString())) {
            *code = 4;
            return false;
        }
    }

    if (!job.setTarget(params["target"].GetString())) {
        *code = 5;
        return false;
    }

    job.setHeight(Json::getUint64(params, "height"));
    m_job.setClientId(m_rpcId);

    if (m_job != job)
    {
        m_jobs++;
        m_job = std::move(job);

        const uint8_t* blob = m_job.blob();
        size_t blob_size = m_job.size();

        std::vector<uint8_t> b(blob + 2, blob + (blob_size - 2));
        uint64_t t_stamp = 0;
        int read = tools::read_varint(b.begin(), b.end(), t_stamp);

        uint8_t id_num_bytes[4] = {0};
        id_num_bytes[2] = b[read++];
        id_num_bytes[1] = b[read++];
        id_num_bytes[0] = b[read++];

        uint32_t id_num = *((uint32_t*)id_num_bytes);

        if (id_num < 1)
            id_num = 1;

        uint64_t extra_iters = ((t_stamp % id_num) + job.height()) & 0x7FFF;

        printf("%lu\n", 0x40000 + extra_iters);

        m_job.setExtraIters(extra_iters);
        
        return true;
    }

    if (m_jobs == 0) { // https://github.com/xmrig/xmrig/issues/459
        return false;
    }

    if (!isQuiet()) {
        LOG_WARN("[%s] duplicate job received, reconnect", url());
    }

    close();
    return false;
}